

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void __thiscall zsummer::log4z::CLogerManager::~CLogerManager(CLogerManager *this)

{
  long lVar1;
  
  (this->super_CThread)._vptr_CThread = (_func_int **)&PTR__CLogerManager_0014ab28;
  (this->super_ILog4zManager)._vptr_ILog4zManager = (_func_int **)&PTR__CLogerManager_0014abd8;
  Stop(this);
  CLock::~CLock(&this->m_lock);
  std::__cxx11::_List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>::
  _M_clear(&(this->m_logs).
            super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>)
  ;
  lVar1 = 0x570;
  do {
    LoggerInfo::~LoggerInfo((LoggerInfo *)((long)&(this->super_CThread)._vptr_CThread + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != 0x20);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->m_ids)._M_t);
  std::__cxx11::string::~string((string *)&this->m_configFile);
  CSem::~CSem(&this->m_semaphore);
  return;
}

Assistant:

~CLogerManager()
	{
		Stop();
	}